

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O2

void __thiscall
DataSourceDOS::SpriteDosSolid::SpriteDosSolid(SpriteDosSolid *this,PBuffer *_data,ColorDOS *palette)

{
  byte bVar1;
  uchar value;
  uchar value_00;
  element_type *peVar2;
  byte *pbVar3;
  bool bVar4;
  uint8_t *puVar5;
  ExceptionFreeserf *this_00;
  undefined4 local_64;
  PMutableBuffer result;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,(PBuffer *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_00151e50;
  if (((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size ==
      (this->super_SpriteBaseDOS).super_SpriteBase.height *
      (this->super_SpriteBaseDOS).super_SpriteBase.width + 10) {
    local_64 = 0;
    std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&result);
    while( true ) {
      bVar4 = Buffer::readable((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      if (!bVar4) break;
      peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pbVar3 = peVar2->read;
      bVar1 = *pbVar3;
      peVar2->read = pbVar3 + 1;
      value = palette[bVar1].r;
      value_00 = palette[bVar1].g;
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 palette[bVar1].b,1);
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 value_00,1);
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value,1
                );
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0xff,1)
      ;
    }
    puVar5 = (uint8_t *)
             MutableBuffer::unfix
                       (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"Failed to extract DOS solid sprite",(allocator<char> *)&local_64);
  ExceptionFreeserf::ExceptionFreeserf(this_00,(string *)&result);
  __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

DataSourceDOS::SpriteDosSolid::SpriteDosSolid(PBuffer _data, ColorDOS *palette)
  : SpriteBaseDOS(_data) {
  size_t size = _data->get_size();
  if (size != (width * height + 10)) {
    throw ExceptionFreeserf("Failed to extract DOS solid sprite");
  }

  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    ColorDOS color = palette[_data->pop<uint8_t>()];
    result->push<uint8_t>(color.b);  // Blue
    result->push<uint8_t>(color.g);  // Green
    result->push<uint8_t>(color.r);  // Red
    result->push<uint8_t>(0xff);     // Alpha
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}